

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementBeamANCF_3333 *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_> *pPVar10;
  long lVar11;
  double *pdVar12;
  undefined8 *puVar13;
  long lVar14;
  double *pdVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  double *pdVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ActualDstType actualDst;
  long lVar23;
  ulong uVar24;
  ActualDstType actualDst_1;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3>_conflict1 SD_precompute_D;
  type tmp;
  MatrixNx3c Sxi_D;
  assign_op<double,_double> local_3c1;
  Matrix3xN *local_3c0;
  Matrix3xN *local_3b8;
  ulong local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  ulong local_390;
  MatrixNx3c *local_388;
  SrcXprType local_380;
  Matrix<double,_3,_3,_1,_3,_3> local_378;
  double local_330;
  double local_328;
  double local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  double local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  ulong local_260;
  double local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  double local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  double local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  double local_1a0 [3];
  ulong local_188;
  Matrix3xN *local_180;
  ulong local_178;
  MatrixNx3c *local_170;
  Matrix<double,_3,_3,_1,_3,_3> local_168;
  MatrixNx3c *local_120;
  Matrix<double,_3,_3,_1,_3,_3> *local_118;
  undefined8 local_110;
  MatrixNx3c local_108;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->m_SD,0x195,9,0x2d);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ_D0,0xc,0xc,1);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ_Dv,3,3,1);
  if (*(long *)(DAT_00b92cb0 + 0x38) != *(long *)(DAT_00b92cb0 + 0x30)) {
    local_180 = &this->m_ebar0;
    local_390 = 0;
    do {
      iVar21 = (int)local_390;
      if (*(long *)(DAT_00b92cb0 + 0x20) != *(long *)(DAT_00b92cb0 + 0x18)) {
        local_3c0 = (Matrix3xN *)0x0;
        uVar22 = local_390;
        local_178 = local_390;
        do {
          lVar11 = *(long *)(DAT_00b92cb0 + 0x18);
          lVar23 = *(long *)(DAT_00b92cb0 + 0x20) - lVar11;
          local_3b8 = local_3c0;
          if (lVar23 != 0) {
            uVar24 = lVar23 >> 3;
            uVar25 = 0;
            do {
              local_398 = *(double *)(*(long *)(static_tables_3333 + 0x30) + local_390 * 8);
              local_3a0 = *(double *)(*(long *)(static_tables_3333 + 0x18) + (long)local_3c0 * 8);
              local_3a8 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar25 * 8);
              lVar23 = uVar24 * local_390;
              pPVar10 = &local_3c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>;
              local_3b0 = uVar25;
              Calc_Sxi_D(this,&local_108,*(double *)(*(long *)(DAT_00b92cb0 + 0x30) + local_390 * 8)
                         ,*(double *)(lVar11 + (long)local_3c0 * 8),*(double *)(lVar11 + uVar25 * 8)
                        );
              Eigen::internal::
              generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
              ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_378,local_180,&local_108);
              local_388 = &local_108;
              local_380.m_xpr = &local_378;
              local_170 = &local_108;
              Eigen::internal::
              Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
              ::run(&local_168,&local_380,&local_3c1);
              local_120 = local_170;
              local_118 = &local_168;
              local_110 = 3;
              auVar29 = *(undefined1 (*) [16])
                         (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                         m_storage.m_data.array;
              auVar39 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 2);
              auVar32 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 4);
              auVar3 = *(undefined1 (*) [16])
                        ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                         m_storage.m_data.array + 6);
              auVar33 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 9);
              auVar37 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 0x12);
              auVar41 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 0xb);
              auVar43 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 0x14);
              auVar45 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 0xd);
              auVar4 = *(undefined1 (*) [16])
                        ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                         m_storage.m_data.array + 0x16);
              auVar34 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 0xf);
              auVar35 = *(undefined1 (*) [16])
                         ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                          m_storage.m_data.array + 0x18);
              dVar1 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                      m_storage.m_data.array[8];
              auVar30._8_8_ = 0;
              auVar30._0_8_ =
                   (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                   m_storage.m_data.array[0x11];
              auVar31._8_8_ = 0;
              auVar31._0_8_ =
                   (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                   m_storage.m_data.array[0x1a];
              lVar11 = 7;
              puVar13 = &local_218;
              do {
                dVar2 = local_1a0[lVar11];
                auVar49._8_8_ = dVar2;
                auVar49._0_8_ = dVar2;
                auVar26 = vmulpd_avx512vl(auVar29,auVar49);
                auVar27._8_8_ = 0;
                auVar27._0_8_ = (&local_188)[lVar11];
                auVar27 = vmovddup_avx512vl(auVar27);
                auVar28 = vfmadd231pd_avx512vl(auVar26,auVar33,auVar27);
                auVar26._8_8_ = 0;
                auVar26._0_8_ =
                     local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[lVar11 + -1];
                auVar26 = vmovddup_avx512vl(auVar26);
                auVar28 = vfmadd231pd_avx512vl(auVar28,auVar37,auVar26);
                *(undefined1 (*) [16])(puVar13 + -8) = auVar28;
                auVar28 = vmulpd_avx512vl(auVar39,auVar49);
                auVar28 = vfmadd231pd_avx512vl(auVar28,auVar41,auVar27);
                auVar28 = vfmadd231pd_avx512vl(auVar28,auVar43,auVar26);
                *(undefined1 (*) [16])(puVar13 + -6) = auVar28;
                auVar28 = vmulpd_avx512vl(auVar32,auVar49);
                auVar28 = vfmadd231pd_avx512vl(auVar28,auVar45,auVar27);
                auVar28 = vfmadd231pd_avx512vl(auVar28,auVar4,auVar26);
                *(undefined1 (*) [16])(puVar13 + -4) = auVar28;
                auVar28 = vmulpd_avx512vl(auVar3,auVar49);
                auVar27 = vfmadd231pd_avx512vl(auVar28,auVar34,auVar27);
                auVar27 = vfmadd231pd_avx512vl(auVar27,auVar35,auVar26);
                *(undefined1 (*) [16])(puVar13 + -2) = auVar27;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = (&local_188)[lVar11];
                auVar27 = vmulsd_avx512f(auVar30,auVar28);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[lVar11 + -1];
                auVar26 = vmulsd_avx512f(auVar31,auVar5);
                auVar27 = vaddsd_avx512f(auVar27,auVar26);
                auVar50._8_8_ = 0;
                auVar50._0_8_ = dVar1 * dVar2;
                auVar27 = vaddsd_avx512f(auVar50,auVar27);
                *puVar13 = auVar27._0_8_;
                lVar11 = lVar11 + 1;
                puVar13 = puVar13 + 9;
              } while (lVar11 != 10);
              lVar11 = (long)((long)(pPVar10->m_storage).m_data.array + lVar23) * uVar24 + uVar25;
              local_330 = local_258;
              local_328 = local_210;
              local_320 = local_1c8;
              local_318 = uStack_250;
              local_310 = local_208;
              local_308 = local_1c0;
              local_300 = local_248;
              local_2f8 = local_200;
              local_2f0 = local_1b8;
              local_2e8 = uStack_240;
              local_2e0 = local_1f8;
              local_2d8 = local_1b0;
              local_2d0 = local_238;
              local_2c8 = local_1f0;
              local_2c0 = local_1a8;
              local_2b8 = uStack_230;
              local_2b0 = local_1e8;
              local_2a8 = local_1a0[0];
              local_2a0 = local_228;
              local_298 = local_1e0;
              local_290 = local_1a0[1];
              local_288 = uStack_220;
              local_280 = local_1d8;
              local_278 = local_1a0[2];
              local_270 = local_218;
              local_268 = local_1d0;
              local_260 = local_188;
              if ((lVar11 < 0) ||
                 (lVar23 = (this->m_kGQ_D0).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols *
                           (this->m_kGQ_D0).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows, lVar23 - lVar11 == 0 || lVar23 < lVar11))
              goto LAB_007431db;
              auVar32._8_8_ = 0;
              auVar32._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[3];
              auVar29._8_8_ = 0;
              auVar29._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[4];
              auVar39._8_8_ = 0;
              auVar39._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
              auVar43._8_8_ = 0;
              auVar43._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
              auVar45._8_8_ = 0;
              auVar45._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7] *
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
              auVar29 = vfmsub231sd_fma(auVar45,auVar29,auVar39);
              auVar41._8_8_ = 0;
              auVar41._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6] *
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
              auVar39 = vfmsub231sd_fma(auVar41,auVar32,auVar39);
              auVar37._8_8_ = 0;
              auVar37._0_8_ =
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6] *
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[4];
              auVar32 = vfmsub231sd_fma(auVar37,auVar32,auVar43);
              auVar3._8_8_ = 0x8000000000000000;
              auVar3._0_8_ = 0x8000000000000000;
              auVar33._8_8_ = 0;
              auVar33._0_8_ =
                   auVar32._0_8_ *
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] +
                   (auVar29._0_8_ *
                    local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                    .m_data.array[0] -
                   auVar39._0_8_ *
                   local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[1]);
              auVar29 = vxorpd_avx512vl(auVar33,auVar3);
              (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data[lVar11] = local_3a0 * local_398 * local_3a8 * auVar29._0_8_;
              pdVar12 = (this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_data;
              lVar23 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_rows;
              if (lVar23 < 0 && pdVar12 != (double *)0x0) goto LAB_007431fa;
              lVar20 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols;
              if (lVar20 <= lVar11) goto LAB_007431bc;
              if (lVar23 != 9) goto LAB_00743219;
              lVar14 = (long)((long)(local_3b8->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>).
                                    m_storage.m_data.array + local_178 * uVar24) * uVar24 +
                       local_3b0;
              pdVar15 = pdVar12 + lVar14;
              pdVar19 = &local_330;
              lVar23 = 9;
              do {
                *pdVar15 = *pdVar19;
                pdVar19 = pdVar19 + 3;
                pdVar15 = pdVar15 + lVar20;
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
              if ((lVar11 + 0xc < 0) ||
                 (lVar23 = (this->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols, lVar23 <= lVar11 + 0xc)) goto LAB_007431bc;
              pdVar15 = pdVar12 + lVar14 + 0xc;
              pdVar19 = &local_328;
              lVar20 = 9;
              do {
                *pdVar15 = *pdVar19;
                pdVar19 = pdVar19 + 3;
                pdVar15 = pdVar15 + lVar23;
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
              if ((lVar11 + 0x18 < 0) ||
                 (lVar23 = (this->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols, lVar23 <= lVar11 + 0x18)) goto LAB_007431bc;
              pdVar12 = pdVar12 + lVar14 + 0x18;
              pdVar15 = &local_320;
              lVar11 = 9;
              do {
                *pdVar12 = *pdVar15;
                pdVar15 = pdVar15 + 3;
                pdVar12 = pdVar12 + lVar23;
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
              uVar25 = (ulong)((int)local_3b0 + 1);
              lVar11 = *(long *)(DAT_00b92cb0 + 0x18);
              uVar24 = *(long *)(DAT_00b92cb0 + 0x20) - lVar11 >> 3;
              uVar22 = local_178;
            } while (uVar25 < uVar24);
          }
          iVar21 = (int)uVar22;
          local_3c0 = (Matrix3xN *)(ulong)((int)local_3b8 + 1);
        } while (local_3c0 <
                 (undefined1 *)
                 (*(long *)(DAT_00b92cb0 + 0x20) - *(long *)(DAT_00b92cb0 + 0x18) >> 3));
      }
      local_390 = (ulong)(iVar21 + 1);
    } while (local_390 <
             (ulong)(*(long *)(DAT_00b92cb0 + 0x38) - *(long *)(DAT_00b92cb0 + 0x30) >> 3));
  }
  lVar11 = *(long *)(DAT_00b92cb0 + 0x30);
  if (*(long *)(DAT_00b92cb0 + 0x38) != lVar11) {
    local_3b8 = &this->m_ebar0;
    uVar22 = 0;
    uVar16 = 0x24;
    uVar17 = 0x27;
    uVar18 = 0x2a;
    do {
      local_3b0 = CONCAT44(local_3b0._4_4_,uVar18);
      local_3c0 = (Matrix3xN *)((ulong)uVar18 << 3);
      local_3a8 = (double)CONCAT44(local_3a8._4_4_,uVar17);
      local_3a0 = (double)CONCAT44(local_3a0._4_4_,uVar16);
      local_398 = *(double *)(*(long *)(static_tables_3333 + 0x30) + uVar22 * 8);
      local_398 = local_398 + local_398;
      Calc_Sxi_D(this,&local_108,*(double *)(lVar11 + uVar22 * 8),0.0,0.0);
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_378,local_3b8,&local_108);
      local_388 = &local_108;
      local_380.m_xpr = &local_378;
      local_170 = &local_108;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_168,&local_380,&local_3c1);
      local_120 = local_170;
      local_118 = &local_168;
      local_110 = 3;
      auVar29 = *(undefined1 (*) [16])
                 (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array;
      auVar39 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 2);
      auVar32 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 4);
      auVar3 = *(undefined1 (*) [16])
                ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array + 6);
      auVar33 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 9);
      auVar37 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0x12);
      auVar41 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0xb);
      auVar43 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0x14);
      auVar45 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0xd);
      auVar4 = *(undefined1 (*) [16])
                ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage
                 .m_data.array + 0x16);
      auVar34 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0xf);
      auVar35 = *(undefined1 (*) [16])
                 ((local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).
                  m_storage.m_data.array + 0x18);
      dVar1 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage.
              m_data.array[8];
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage.
           m_data.array[0x11];
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           (local_170->super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>).m_storage.
           m_data.array[0x1a];
      lVar11 = 7;
      puVar13 = &local_218;
      do {
        dVar2 = local_1a0[lVar11];
        auVar51._8_8_ = dVar2;
        auVar51._0_8_ = dVar2;
        auVar30 = vmulpd_avx512vl(auVar29,auVar51);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (&local_188)[lVar11];
        auVar31 = vmovddup_avx512vl(auVar6);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar33,auVar31);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[lVar11 + -1];
        auVar27 = vmovddup_avx512vl(auVar7);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar37,auVar27);
        *(undefined1 (*) [16])(puVar13 + -8) = auVar30;
        auVar30 = vmulpd_avx512vl(auVar39,auVar51);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar41,auVar31);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar43,auVar27);
        *(undefined1 (*) [16])(puVar13 + -6) = auVar30;
        auVar30 = vmulpd_avx512vl(auVar32,auVar51);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar45,auVar31);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar4,auVar27);
        *(undefined1 (*) [16])(puVar13 + -4) = auVar30;
        auVar30 = vmulpd_avx512vl(auVar3,auVar51);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar34,auVar31);
        auVar30 = vfmadd231pd_avx512vl(auVar30,auVar35,auVar27);
        *(undefined1 (*) [16])(puVar13 + -2) = auVar30;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (&local_188)[lVar11];
        auVar30 = vmulsd_avx512f(auVar47,auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[lVar11 + -1];
        auVar31 = vmulsd_avx512f(auVar48,auVar9);
        auVar30 = vaddsd_avx512f(auVar30,auVar31);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = dVar1 * dVar2;
        auVar30 = vaddsd_avx512f(auVar52,auVar30);
        *puVar13 = auVar30._0_8_;
        lVar11 = lVar11 + 1;
        puVar13 = puVar13 + 9;
      } while (lVar11 != 10);
      local_330 = local_258;
      local_328 = local_210;
      local_320 = local_1c8;
      local_318 = uStack_250;
      local_310 = local_208;
      local_308 = local_1c0;
      local_300 = local_248;
      local_2f8 = local_200;
      local_2f0 = local_1b8;
      local_2e8 = uStack_240;
      local_2e0 = local_1f8;
      local_2d8 = local_1b0;
      local_2d0 = local_238;
      local_2c8 = local_1f0;
      local_2c0 = local_1a8;
      local_2b8 = uStack_230;
      local_2b0 = local_1e8;
      local_2a8 = local_1a0[0];
      local_2a0 = local_228;
      local_298 = local_1e0;
      local_290 = local_1a0[1];
      local_288 = uStack_220;
      local_280 = local_1d8;
      local_278 = local_1a0[2];
      local_270 = local_218;
      local_268 = local_1d0;
      local_260 = local_188;
      lVar11 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols *
               (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if (lVar11 - uVar22 == 0 || lVar11 < (long)uVar22) {
LAB_007431db:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar40._8_8_ = 0;
      auVar40._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar44._8_8_ = 0;
      auVar44._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[6] *
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar29 = vfmsub231sd_fma(auVar44,auVar40,auVar34);
      auVar46._8_8_ = 0;
      auVar46._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[7] *
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar39 = vfmsub231sd_fma(auVar35,auVar46,auVar42);
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[6] *
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar32 = vfmsub231sd_fma(auVar38,auVar40,auVar46);
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           auVar29._0_8_ *
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[2] +
           (auVar39._0_8_ *
            local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[0] -
           auVar32._0_8_ *
           local_378.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[1]);
      auVar29 = vxorpd_avx512vl(auVar36,auVar4);
      (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data[uVar22] = (local_398 + local_398) * auVar29._0_8_;
      pdVar12 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar11 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar11 < 0 && pdVar12 != (double *)0x0) {
LAB_007431fa:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      iVar21 = (int)uVar22;
      lVar23 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar23 <= (long)(ulong)(iVar21 + 0x24)) {
LAB_007431bc:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (lVar11 != 9) {
LAB_00743219:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      pdVar19 = pdVar12 + uVar16;
      pdVar15 = &local_330;
      lVar11 = 9;
      do {
        *pdVar19 = *pdVar15;
        pdVar15 = pdVar15 + 3;
        pdVar19 = pdVar19 + lVar23;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar11 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar11 <= (long)(ulong)(iVar21 + 0x27)) goto LAB_007431bc;
      pdVar19 = pdVar12 + uVar17;
      pdVar15 = &local_328;
      lVar23 = 9;
      do {
        *pdVar19 = *pdVar15;
        pdVar15 = pdVar15 + 3;
        pdVar19 = pdVar19 + lVar11;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      lVar11 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar11 <= (long)(ulong)(iVar21 + 0x2a)) goto LAB_007431bc;
      pdVar12 = (double *)
                ((long)(local_3c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>).
                       m_storage.m_data.array + (long)pdVar12);
      pdVar15 = &local_320;
      lVar23 = 9;
      do {
        *pdVar12 = *pdVar15;
        pdVar15 = pdVar15 + 3;
        pdVar12 = pdVar12 + lVar11;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      uVar22 = (ulong)(iVar21 + 1);
      lVar11 = *(long *)(DAT_00b92cb0 + 0x30);
      uVar16 = local_3a0._0_4_ + 1;
      uVar17 = local_3a8._0_4_ + 1;
      uVar18 = (int)local_3b0 + 1;
    } while (uVar22 < (ulong)(*(long *)(DAT_00b92cb0 + 0x38) - lVar11 >> 3));
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = NP - 1;        // Gauss-Quadrature table index for xi
    unsigned int GQ_idx_eta_zeta = NT - 1;  // Gauss-Quadrature table index for eta and zeta

    m_SD.resize(NSF, 3 * NIP);
    m_kGQ_D0.resize(NIP_D0, 1);
    m_kGQ_Dv.resize(NIP_Dv, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    // Precalculate the matrices of normalized shape function derivatives corrected for a potentially non-straight
    // reference configuration & GQ Weights times the determinant of the element Jacobian for later use in the
    // generalized internal force and Jacobian calculations.

    // First calculate the matrices and constants for the portion of the Enhance Continuum Mechanics/Selective Reduced
    // Integration that does not include the Poisson effect.
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                auto index = it_zeta + it_eta * GQTable->Lroots[GQ_idx_eta_zeta].size() +
                             it_xi * GQTable->Lroots[GQ_idx_eta_zeta].size() * GQTable->Lroots[GQ_idx_eta_zeta].size();
                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                SD_precompute_D = Sxi_D * J_0xi.inverse();
                m_kGQ_D0(index) = -J_0xi.determinant() * GQ_weight;

                // Group all of the columns together in blocks with the shape function derivatives for the section that
                // does not include the Poisson effect at the beginning of m_SD
                m_SD.col(index) = SD_precompute_D.col(0);
                m_SD.col(index + NIP_D0) = SD_precompute_D.col(1);
                m_SD.col(index + 2 * NIP_D0) = SD_precompute_D.col(2);

                index++;
            }
        }
    }

    // Next calculate the matrices and constants for the portion of the Enhance Continuum Mechanics/Selective Reduced
    // Integration that includes the Poisson effect, but integrating across the volume of the element with one 1 point
    // GQ for the cross section directions.
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * 2 * 2;
        double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
        double eta = 0;
        double zeta = 0;
        ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
        MatrixNx3c Sxi_D;          // Matrix of normalized shape function derivatives

        Calc_Sxi_D(Sxi_D, xi, eta, zeta);
        J_0xi.noalias() = m_ebar0 * Sxi_D;

        // Adjust the shape function derivative matrix to account for a potentially deformed reference state
        SD_precompute_D = Sxi_D * J_0xi.inverse();
        m_kGQ_Dv(it_xi) = -J_0xi.determinant() * GQ_weight;

        // Group all of the columns together in blocks with the shape function derivative for the Poisson effect at the
        // end of m_SD
        m_SD.col(3 * NIP_D0 + it_xi) = SD_precompute_D.col(0);
        m_SD.col(3 * NIP_D0 + NIP_Dv + it_xi) = SD_precompute_D.col(1);
        m_SD.col(3 * NIP_D0 + 2 * NIP_Dv + it_xi) = SD_precompute_D.col(2);
    }
}